

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
spirv_cross::Compiler::interface_variable_exists_in_entry_point(Compiler *this,uint32_t id)

{
  uint32_t uVar1;
  SPIRVariable *pSVar2;
  SPIREntryPoint *pSVar3;
  TypedID<(spirv_cross::Types)2> *pTVar4;
  CompilerError *this_00;
  
  pSVar2 = get<spirv_cross::SPIRVariable>(this,id);
  uVar1 = ParsedIR::get_spirv_version(&this->ir);
  if (uVar1 < 0x10400) {
    if ((StorageClassOutput < pSVar2->storage) || (pSVar2->storage == StorageClassUniform)) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Only Input, Output variables and Uniform constants are part of a shader linking interface."
                );
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->ir).entry_points._M_h._M_element_count < 2) {
      return true;
    }
  }
  pSVar3 = get_entry_point(this);
  pTVar4 = (pSVar3->interface_variables).
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
  pTVar4 = ::std::
           __find_if<spirv_cross::TypedID<(spirv_cross::Types)2>const*,__gnu_cxx::__ops::_Iter_equals_val<spirv_cross::TypedID<(spirv_cross::Types)2>const>>
                     (pTVar4,pTVar4 + (pSVar3->interface_variables).
                                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>
                                      .buffer_size);
  return pTVar4 != (pSVar3->interface_variables).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr +
                   (pSVar3->interface_variables).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
}

Assistant:

bool Compiler::interface_variable_exists_in_entry_point(uint32_t id) const
{
	auto &var = get<SPIRVariable>(id);

	if (ir.get_spirv_version() < 0x10400)
	{
		if (var.storage != StorageClassInput && var.storage != StorageClassOutput &&
		    var.storage != StorageClassUniformConstant)
			SPIRV_CROSS_THROW("Only Input, Output variables and Uniform constants are part of a shader linking interface.");

		// This is to avoid potential problems with very old glslang versions which did
		// not emit input/output interfaces properly.
		// We can assume they only had a single entry point, and single entry point
		// shaders could easily be assumed to use every interface variable anyways.
		if (ir.entry_points.size() <= 1)
			return true;
	}

	// In SPIR-V 1.4 and later, all global resource variables must be present.

	auto &execution = get_entry_point();
	return find(begin(execution.interface_variables), end(execution.interface_variables), VariableID(id)) !=
	       end(execution.interface_variables);
}